

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O3

void aec_get_rsi_lsb_24(aec_stream *strm)

{
  uchar *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  
  puVar1 = strm->next_in;
  uVar3 = strm->block_size * strm->rsi;
  if (0 < (int)uVar3) {
    puVar2 = strm->state->data_raw;
    puVar4 = puVar1 + 2;
    uVar5 = 0;
    do {
      puVar2[uVar5] = (uint)CONCAT12(*puVar4,*(undefined2 *)(puVar4 + -2));
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + 3;
    } while (uVar3 != uVar5);
  }
  strm->next_in = puVar1 + (int)(uVar3 * 3);
  strm->avail_in = strm->avail_in - (long)(int)(uVar3 * 3);
  return;
}

Assistant:

void aec_get_rsi_lsb_24(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[3 * i]
            | ((uint32_t)in[3 * i + 1] << 8)
            | ((uint32_t)in[3 * i + 2] << 16);

    strm->next_in += 3 * rsi;
    strm->avail_in -= 3 * rsi;
}